

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::V0LayerParameter::ByteSizeLong(V0LayerParameter *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Type *this_00;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar5 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = sVar6 + (ulong)uVar5 * 2;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(this->blobs_).super_RepeatedPtrFieldBase,uVar10);
      sVar6 = BlobProto::ByteSizeLong(this_00);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  sVar6 = lVar11 + ((ulong)(uint)(this->weight_decay_).current_size_ +
                   (ulong)(uint)(this->blobs_lr_).current_size_) * 6;
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = ((this->type_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      sVar2 = ((this->source_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 8) != 0) {
      sVar2 = ((this->meanfile_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 0x10) != 0) {
      sVar2 = ((this->det_crop_mode_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 0x20) != 0) {
      sVar7 = FillerParameter::ByteSizeLong(this->weight_filler_);
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      uVar5 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar5 & 0x40) != 0) {
      sVar7 = FillerParameter::ByteSizeLong(this->bias_filler_);
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      uVar5 = (this->_has_bits_).has_bits_[0];
    }
    if ((char)uVar5 < '\0') {
      sVar7 = HDF5OutputParameter::ByteSizeLong(this->hdf5_output_param_);
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
      uVar5 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar5 & 0xff00) != 0) {
    if ((uVar5 >> 8 & 1) != 0) {
      uVar10 = this->num_output_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 >> 9 & 1) != 0) {
      uVar10 = this->pad_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 >> 10 & 1) != 0) {
      uVar10 = this->kernelsize_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 >> 0xb & 1) != 0) {
      if (this->pool_ < 0) {
        uVar8 = 0xb;
      }
      else {
        uVar10 = this->pool_ | 1;
        iVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar8;
    }
    if ((uVar5 >> 0xc & 1) != 0) {
      uVar10 = this->batchsize_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 >> 0xd & 1) != 0) {
      uVar10 = this->cropsize_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 >> 0xe & 1) != 0) {
      if (this->new_width_ < 0) {
        uVar8 = 0xc;
      }
      else {
        uVar10 = this->new_width_ | 1;
        iVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 2);
      }
      sVar6 = sVar6 + uVar8;
    }
    if ((short)uVar5 < 0) {
      sVar6 = sVar6 + 3;
    }
  }
  if ((uVar5 & 0xff0000) != 0) {
    sVar7 = sVar6 + 3;
    if ((uVar5 >> 0x10 & 1) == 0) {
      sVar7 = sVar6;
    }
    if ((uVar5 >> 0x11 & 1) != 0) {
      uVar10 = this->rand_skip_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 >> 0x12 & 1) != 0) {
      uVar10 = this->det_context_pad_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 >> 0x13 & 1) != 0) {
      if (this->new_num_ < 0) {
        uVar8 = 0xc;
      }
      else {
        uVar10 = this->new_num_ | 1;
        iVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar8;
    }
    if ((uVar5 >> 0x14 & 1) != 0) {
      if (this->new_channels_ < 0) {
        uVar8 = 0xc;
      }
      else {
        uVar10 = this->new_channels_ | 1;
        iVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar8;
    }
    if ((uVar5 >> 0x15 & 1) != 0) {
      if (this->new_height_ < 0) {
        uVar8 = 0xc;
      }
      else {
        uVar10 = this->new_height_ | 1;
        iVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar8;
    }
    if ((uVar5 >> 0x16 & 1) != 0) {
      uVar10 = this->concat_dim_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
    sVar6 = (uVar5 >> 0x16 & 2) + sVar7;
  }
  if (0xffffff < uVar5) {
    if ((uVar5 >> 0x18 & 1) != 0) {
      uVar10 = this->group_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 >> 0x19 & 1) != 0) {
      uVar10 = this->stride_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    sVar7 = sVar6 + 5;
    if ((uVar5 >> 0x1a & 1) == 0) {
      sVar7 = sVar6;
    }
    if ((uVar5 >> 0x1b & 1) != 0) {
      uVar10 = this->local_size_ | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    sVar6 = sVar7 + 5;
    if ((uVar5 >> 0x1c & 1) == 0) {
      sVar6 = sVar7;
    }
    sVar7 = sVar6 + 5;
    if ((uVar5 >> 0x1d & 1) == 0) {
      sVar7 = sVar6;
    }
    sVar9 = sVar7 + 6;
    if ((uVar5 >> 0x1e & 1) == 0) {
      sVar9 = sVar7;
    }
    sVar6 = sVar9 + 6;
    if (-1 < (int)uVar5) {
      sVar6 = sVar9;
    }
  }
  uVar5 = (this->_has_bits_).has_bits_[1];
  if ((uVar5 & 7) != 0) {
    sVar7 = sVar6 + 6;
    if ((uVar5 & 1) == 0) {
      sVar7 = sVar6;
    }
    sVar9 = sVar7 + 6;
    if ((uVar5 & 2) == 0) {
      sVar9 = sVar7;
    }
    sVar6 = sVar9 + 6;
    if ((uVar5 & 4) == 0) {
      sVar6 = sVar9;
    }
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t V0LayerParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.V0LayerParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.BlobProto blobs = 50;
  {
    unsigned int count = this->blobs_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->blobs(i));
    }
  }

  // repeated float blobs_lr = 51;
  {
    unsigned int count = this->blobs_lr_size();
    size_t data_size = 4UL * count;
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->blobs_lr_size());
    total_size += data_size;
  }

  // repeated float weight_decay = 52;
  {
    unsigned int count = this->weight_decay_size();
    size_t data_size = 4UL * count;
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->weight_decay_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string type = 2;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional string source = 16;
    if (has_source()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string meanfile = 18;
    if (has_meanfile()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->meanfile());
    }

    // optional string det_crop_mode = 59 [default = "warp"];
    if (has_det_crop_mode()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->det_crop_mode());
    }

    // optional .caffe.FillerParameter weight_filler = 5;
    if (has_weight_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->weight_filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 6;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
    if (has_hdf5_output_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->hdf5_output_param_);
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional uint32 num_output = 3;
    if (has_num_output()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->num_output());
    }

    // optional uint32 pad = 7 [default = 0];
    if (has_pad()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->pad());
    }

    // optional uint32 kernelsize = 8;
    if (has_kernelsize()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->kernelsize());
    }

    // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
    if (has_pool()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->pool());
    }

    // optional uint32 batchsize = 19;
    if (has_batchsize()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batchsize());
    }

    // optional uint32 cropsize = 20 [default = 0];
    if (has_cropsize()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->cropsize());
    }

    // optional int32 new_width = 63 [default = 0];
    if (has_new_width()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_width());
    }

    // optional bool mirror = 21 [default = false];
    if (has_mirror()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[16 / 32] & 16711680u) {
    // optional bool shuffle_images = 64 [default = false];
    if (has_shuffle_images()) {
      total_size += 2 + 1;
    }

    // optional uint32 rand_skip = 53 [default = 0];
    if (has_rand_skip()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->rand_skip());
    }

    // optional uint32 det_context_pad = 58 [default = 0];
    if (has_det_context_pad()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->det_context_pad());
    }

    // optional int32 new_num = 60 [default = 0];
    if (has_new_num()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_num());
    }

    // optional int32 new_channels = 61 [default = 0];
    if (has_new_channels()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_channels());
    }

    // optional int32 new_height = 62 [default = 0];
    if (has_new_height()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_height());
    }

    // optional uint32 concat_dim = 65 [default = 1];
    if (has_concat_dim()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->concat_dim());
    }

    // optional bool biasterm = 4 [default = true];
    if (has_biasterm()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    // optional uint32 group = 9 [default = 1];
    if (has_group()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->group());
    }

    // optional uint32 stride = 10 [default = 1];
    if (has_stride()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->stride());
    }

    // optional float dropout_ratio = 12 [default = 0.5];
    if (has_dropout_ratio()) {
      total_size += 1 + 4;
    }

    // optional uint32 local_size = 13 [default = 5];
    if (has_local_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->local_size());
    }

    // optional float alpha = 14 [default = 1];
    if (has_alpha()) {
      total_size += 1 + 4;
    }

    // optional float beta = 15 [default = 0.75];
    if (has_beta()) {
      total_size += 1 + 4;
    }

    // optional float scale = 17 [default = 1];
    if (has_scale()) {
      total_size += 2 + 4;
    }

    // optional float k = 22 [default = 1];
    if (has_k()) {
      total_size += 2 + 4;
    }

  }
  if (_has_bits_[32 / 32] & 7u) {
    // optional float det_fg_threshold = 54 [default = 0.5];
    if (has_det_fg_threshold()) {
      total_size += 2 + 4;
    }

    // optional float det_bg_threshold = 55 [default = 0.5];
    if (has_det_bg_threshold()) {
      total_size += 2 + 4;
    }

    // optional float det_fg_fraction = 56 [default = 0.25];
    if (has_det_fg_fraction()) {
      total_size += 2 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}